

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O0

void ut::are_equal<unsigned_short,48ul,std::vector<unsigned_short,std::allocator<unsigned_short>>>
               (unsigned_short (*expected) [48],
               vector<unsigned_short,_std::allocator<unsigned_short>_> *actual,
               LocationInfo *location)

{
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__first1;
  bool value;
  const_iterator cVar1;
  const_iterator __last;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__last1;
  unsigned_long local_30 [2];
  LocationInfo *local_20;
  LocationInfo *location_local;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *actual_local;
  unsigned_short (*expected_local) [48];
  
  local_30[1] = 0x30;
  local_20 = location;
  location_local = (LocationInfo *)actual;
  actual_local = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)expected;
  cVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(actual);
  __last = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)location_local);
  local_30[0] = std::
                distance<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                          ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                            )cVar1._M_current,
                           (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                            )__last._M_current);
  are_equal<unsigned_long,unsigned_long>(local_30 + 1,local_30,local_20);
  __first1 = actual_local;
  __last1 = actual_local + 4;
  cVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)location_local);
  value = std::
          equal<unsigned_short*,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                    ((unsigned_short *)__first1,(unsigned_short *)__last1,
                     (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                      )cVar1._M_current);
  is_true(value,local_20);
  return;
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}